

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::load_graphicsmagick_external
          (CImg<unsigned_char> *this,char *filename)

{
  int iVar1;
  uint uVar2;
  FILE *pFVar3;
  char *pcVar4;
  char *pcVar5;
  CImgArgumentException *this_00;
  CImgIOException *this_01;
  char filetmp [512];
  char command [1024];
  
  if (filename == (char *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
    pcVar4 = "non-";
    if (this->_is_shared != false) {
      pcVar4 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_graphicsmagick_external() : Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar4,"unsigned char");
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,std::exception::~exception);
  }
  memset(command,0,0x400);
  memset(filetmp,0,0x200);
  if (cimg::graphicsmagick_path(char_const*,bool)::st_path == (char *)0x0) {
    pcVar4 = (char *)operator_new__(0x400);
    cimg::graphicsmagick_path(char_const*,bool)::st_path = pcVar4;
    memset(pcVar4 + 5,0,0x3fb);
    builtin_strncpy(pcVar4,"./gm",5);
    pFVar3 = fopen(pcVar4,"r");
    pcVar4 = cimg::graphicsmagick_path(char_const*,bool)::st_path;
    if (pFVar3 == (FILE *)0x0) {
      cimg::graphicsmagick_path(char_const*,bool)::st_path[2] = '\0';
      pcVar4[0] = 'g';
      pcVar4[1] = 'm';
    }
    else if ((_stdin != pFVar3) && (_stdout != pFVar3)) {
      uVar2 = fclose(pFVar3);
      if (uVar2 != 0) {
        cimg::warn("cimg::fclose() : Error code %d returned during file closing.",(ulong)uVar2);
      }
    }
  }
  snprintf(command,0x400,"%s convert \"%s\" pnm:-",
           cimg::graphicsmagick_path(char_const*,bool)::st_path,filename);
  pFVar3 = popen(command,"r");
  if (pFVar3 == (FILE *)0x0) {
    pcVar4 = cimg::temporary_path((char *)0x0,false);
    pcVar5 = cimg::filenamerand();
    snprintf(filetmp,0x200,"%s%c%s.pnm",pcVar4,0x2f,pcVar5);
    pFVar3 = fopen(filetmp,"rb");
    if (pFVar3 != (FILE *)0x0) {
      do {
        if ((_stdin != pFVar3) && (_stdout != pFVar3)) {
          iVar1 = fclose(pFVar3);
          if (iVar1 != 0) {
            cimg::warn("cimg::fclose() : Error code %d returned during file closing.");
          }
        }
        pcVar4 = cimg::temporary_path((char *)0x0,false);
        pcVar5 = cimg::filenamerand();
        snprintf(filetmp,0x200,"%s%c%s.pnm",pcVar4,0x2f,pcVar5);
        pFVar3 = fopen(filetmp,"rb");
      } while (pFVar3 != (FILE *)0x0);
    }
    if (cimg::graphicsmagick_path(char_const*,bool)::st_path == (char *)0x0) {
      pcVar4 = (char *)operator_new__(0x400);
      cimg::graphicsmagick_path(char_const*,bool)::st_path = pcVar4;
      memset(pcVar4 + 5,0,0x3fb);
      builtin_strncpy(pcVar4,"./gm",5);
      pFVar3 = fopen(pcVar4,"r");
      pcVar4 = cimg::graphicsmagick_path(char_const*,bool)::st_path;
      if (pFVar3 == (FILE *)0x0) {
        cimg::graphicsmagick_path(char_const*,bool)::st_path[2] = '\0';
        pcVar4[0] = 'g';
        pcVar4[1] = 'm';
      }
      else if ((_stdin != pFVar3) && (_stdout != pFVar3)) {
        uVar2 = fclose(pFVar3);
        if (uVar2 != 0) {
          cimg::warn("cimg::fclose() : Error code %d returned during file closing.",(ulong)uVar2);
        }
      }
    }
    snprintf(command,0x400,"%s convert \"%s\" \"%s\"",
             cimg::graphicsmagick_path(char_const*,bool)::st_path,filename,filetmp);
    if (cimg::graphicsmagick_path(char_const*,bool)::st_path == (char *)0x0) {
      pcVar4 = (char *)operator_new__(0x400);
      cimg::graphicsmagick_path(char_const*,bool)::st_path = pcVar4;
      memset(pcVar4 + 5,0,0x3fb);
      builtin_strncpy(pcVar4,"./gm",5);
      pFVar3 = fopen(pcVar4,"r");
      pcVar4 = cimg::graphicsmagick_path(char_const*,bool)::st_path;
      if (pFVar3 == (FILE *)0x0) {
        cimg::graphicsmagick_path(char_const*,bool)::st_path[2] = '\0';
        pcVar4[0] = 'g';
        pcVar4[1] = 'm';
      }
      else if ((_stdin != pFVar3) && (_stdout != pFVar3)) {
        uVar2 = fclose(pFVar3);
        if (uVar2 != 0) {
          cimg::warn("cimg::fclose() : Error code %d returned during file closing.",(ulong)uVar2);
        }
      }
    }
    system(command);
    pFVar3 = fopen(filetmp,"rb");
    if (pFVar3 == (FILE *)0x0) {
      pFVar3 = cimg::fopen(filename,"r");
      cimg::fclose(pFVar3);
      this_01 = (CImgIOException *)__cxa_allocate_exception(0x4008);
      pcVar4 = "non-";
      if (this->_is_shared != false) {
        pcVar4 = "";
      }
      CImgIOException::CImgIOException
                (this_01,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_graphicsmagick_external() : Failed to load file \'%s\' with external command \'gm\'."
                 ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                 (ulong)this->_spectrum,this->_data,pcVar4,"unsigned char",filename);
      __cxa_throw(this_01,&CImgIOException::typeinfo,std::exception::~exception);
    }
    if ((_stdin != pFVar3) && (_stdout != pFVar3)) {
      iVar1 = fclose(pFVar3);
      if (iVar1 != 0) {
        cimg::warn("cimg::fclose() : Error code %d returned during file closing.");
      }
    }
    _load_pnm(this,(FILE *)0x0,filetmp);
    remove(filetmp);
  }
  else {
    _load_pnm(this,(FILE *)pFVar3,(char *)0x0);
    pclose(pFVar3);
  }
  return this;
}

Assistant:

CImg<T>& load_graphicsmagick_external(const char *const filename) {
      if (!filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_graphicsmagick_external() : Specified filename is (null).",
                                    cimg_instance);

      char command[1024] = { 0 }, filetmp[512] = { 0 };
      std::FILE *file = 0;
#if cimg_OS==1
      cimg_snprintf(command,sizeof(command),"%s convert \"%s\" pnm:-",cimg::graphicsmagick_path(),filename);
      file = popen(command,"r");
      if (file) {
        try { load_pnm(file); } catch (...) {
          pclose(file);
          throw CImgIOException(_cimg_instance
                                "load_graphicsmagick_external() : Failed to load file '%s' with external command 'gm'.",
                                cimg_instance,
                                filename);
        }
        pclose(file);
        return *this;
      }
#endif
      do {
        cimg_snprintf(filetmp,sizeof(filetmp),"%s%c%s.pnm",cimg::temporary_path(),cimg_file_separator,cimg::filenamerand());
        if ((file=std::fopen(filetmp,"rb"))!=0) cimg::fclose(file);
      } while (file);
      cimg_snprintf(command,sizeof(command),"%s convert \"%s\" \"%s\"",cimg::graphicsmagick_path(),filename,filetmp);
      cimg::system(command,cimg::graphicsmagick_path());
      if (!(file = std::fopen(filetmp,"rb"))) {
        cimg::fclose(cimg::fopen(filename,"r"));
        throw CImgIOException(_cimg_instance
                              "load_graphicsmagick_external() : Failed to load file '%s' with external command 'gm'.",
                              cimg_instance,
                              filename);

      } else cimg::fclose(file);
      load_pnm(filetmp);
      std::remove(filetmp);
      return *this;
    }